

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid.h
# Opt level: O0

TV __thiscall Nova::Grid<float,_3>::Center(Grid<float,_3> *this,T_INDEX *index)

{
  Vector<int,_3,_true> *in_RDX;
  T_STORAGE TVar1;
  Vector<float,_3,_true> local_44;
  Vector<float,_3,_true> local_38;
  Vector<float,_3,_true> local_2c;
  T_INDEX *index_local;
  Grid<float,_3> *this_local;
  
  index_local = index;
  this_local = this;
  Vector<float,_3,_true>::Vector<int>(&local_44,in_RDX);
  Vector<float,_3,_true>::operator-(&local_38,0.5);
  Vector<float,_3,_true>::operator*(&local_2c,&local_38);
  TVar1._M_elems =
       (_Type)Vector<float,_3,_true>::operator+
                        ((Vector<float,_3,_true> *)this,(Vector<float,_3,_true> *)(index + 1));
  return (T_STORAGE)(T_STORAGE)TVar1._M_elems;
}

Assistant:

TV Center(const T_INDEX& index) const
    {
        return domain.min_corner+(TV(index)-(T).5)*dX;
    }